

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_checkScalingFactorOneUnitImported_Test::Units_checkScalingFactorOneUnitImported_Test
          (Units_checkScalingFactorOneUnitImported_Test *this)

{
  Units_checkScalingFactorOneUnitImported_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Units_checkScalingFactorOneUnitImported_Test_001b4430;
  return;
}

Assistant:

TEST(Units, checkScalingFactorOneUnitImported)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit(libcellml::Units::StandardUnit::RADIAN, 0, 1.0, 1.0);

    libcellml::ImportSourcePtr import = libcellml::ImportSource::create();
    import->setUrl("I_am_a_url");

    u1->setImportSource(import);

    // Scaling factor returns 0.0 because of imported units.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}